

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O2

UChar32 utf8_nextCharSafeBody_63(uint8_t *s,int32_t *pi,int32_t length,UChar32 c,UBool strict)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar4 = *pi;
  uVar8 = (ulong)uVar4;
  if (0xf4 < c || uVar4 == length) goto LAB_002c7ac4;
  lVar9 = (long)(int)uVar4;
  if (c < 0xf0) {
    if (c < 0xe0) {
      uVar8 = (ulong)uVar4;
      if (0xc1 < c) {
        bVar3 = s[lVar9];
        uVar8 = (ulong)uVar4;
        if ((byte)(bVar3 ^ 0x80) < 0x40) {
          *pi = uVar4 + 1;
          return (bVar3 ^ 0x80) + c * 0x40 + -0x3000;
        }
      }
      goto LAB_002c7ac4;
    }
    uVar5 = c & 0xf;
    bVar3 = s[lVar9];
    if (strict != -2) {
      uVar8 = (ulong)uVar4;
      if (((byte)" 000000000000\x1000"[uVar5] >> (bVar3 >> 5) & 1) != 0) {
        uVar10 = lVar9 + 1;
        uVar8 = (ulong)(uint)length;
        if ((int)uVar10 != length) {
          uVar8 = uVar10 & 0xffffffff;
          if ((byte)(s[uVar10] ^ 0x80) < 0x40) {
            uVar6 = uVar4 + 2;
            uVar5 = (bVar3 & 0x3f) << 6 | uVar5 << 0xc | s[uVar10] ^ 0x80;
            if (((strict < '\x01') || (uVar5 < 0xfdd0)) ||
               ((~uVar5 & 0xfffe) != 0 && 0xfdef < uVar5)) goto LAB_002c7cad;
            goto LAB_002c7ad0;
          }
        }
      }
      goto LAB_002c7ac4;
    }
    bVar3 = bVar3 + 0x80;
    uVar6 = uVar4;
    if ((bVar3 < 0x40) && ((uVar5 != 0 || (0x1f < bVar3)))) {
      uVar7 = (uint)(lVar9 + 1);
      uVar6 = length;
      if ((uVar7 != length) && (bVar2 = s[lVar9 + 1], uVar6 = uVar7, (byte)(bVar2 ^ 0x80) < 0x40)) {
        *pi = uVar4 + 2;
        return uVar5 << 0xc | bVar2 ^ 0x80 | (uint)bVar3 << 6;
      }
    }
LAB_002c7b5b:
    uVar4 = -(uint)(strict != -3) | 0xfffd;
  }
  else {
    uVar8 = (ulong)uVar4;
    if (((byte)""[s[lVar9] >> 4] >> (c & 7U) & 1) == 0) {
LAB_002c7ac4:
      uVar6 = (uint)uVar8;
      if (strict < '\0') goto LAB_002c7b5b;
    }
    else {
      uVar8 = lVar9 + 1;
      if ((int)uVar8 == length) {
        uVar8 = (ulong)(uint)length;
        goto LAB_002c7ac4;
      }
      pbVar1 = s + uVar8;
      if (0x3f < (byte)(*pbVar1 ^ 0x80)) goto LAB_002c7ac4;
      uVar10 = lVar9 + 2;
      uVar8 = (ulong)(uint)length;
      if ((int)uVar10 == length) goto LAB_002c7ac4;
      uVar8 = uVar10 & 0xffffffff;
      if (0x3f < (byte)(s[uVar10] ^ 0x80)) goto LAB_002c7ac4;
      uVar6 = uVar4 + 3;
      uVar7 = (s[lVar9] & 0x3f) << 0xc | (c & 7U) << 0x12;
      uVar5 = (*pbVar1 ^ 0x80) << 6 | s[uVar10] ^ 0x80 | uVar7;
      if (((strict < '\x01') || (uVar5 < 0xfdd0)) ||
         ((0xfdef < uVar5 && (((~uVar5 & 0xfffe) != 0 || (0x10ffff < uVar7)))))) {
LAB_002c7cad:
        *pi = uVar6;
        return uVar5;
      }
    }
LAB_002c7ad0:
    uVar4 = utf8_errorValue[(int)(uVar6 - uVar4)];
  }
  *pi = uVar6;
  return uVar4;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utf8_nextCharSafeBody(const uint8_t *s, int32_t *pi, int32_t length, UChar32 c, UBool strict) {
    // *pi is one after byte c.
    int32_t i=*pi;
    // length can be negative for NUL-terminated strings: Read and validate one byte at a time.
    if(i==length || c>0xf4) {
        // end of string, or not a lead byte
    } else if(c>=0xf0) {
        // Test for 4-byte sequences first because
        // U8_NEXT() handles shorter valid sequences inline.
        uint8_t t1=s[i], t2, t3;
        c&=7;
        if(U8_IS_VALID_LEAD4_AND_T1(c, t1) &&
                ++i!=length && (t2=s[i]-0x80)<=0x3f &&
                ++i!=length && (t3=s[i]-0x80)<=0x3f) {
            ++i;
            c=(c<<18)|((t1&0x3f)<<12)|(t2<<6)|t3;
            // strict: forbid non-characters like U+fffe
            if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                *pi=i;
                return c;
            }
        }
    } else if(c>=0xe0) {
        c&=0xf;
        if(strict!=-2) {
            uint8_t t1=s[i], t2;
            if(U8_IS_VALID_LEAD3_AND_T1(c, t1) &&
                    ++i!=length && (t2=s[i]-0x80)<=0x3f) {
                ++i;
                c=(c<<12)|((t1&0x3f)<<6)|t2;
                // strict: forbid non-characters like U+fffe
                if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                    *pi=i;
                    return c;
                }
            }
        } else {
            // strict=-2 -> lenient: allow surrogates
            uint8_t t1=s[i]-0x80, t2;
            if(t1<=0x3f && (c>0 || t1>=0x20) &&
                    ++i!=length && (t2=s[i]-0x80)<=0x3f) {
                *pi=i+1;
                return (c<<12)|(t1<<6)|t2;
            }
        }
    } else if(c>=0xc2) {
        uint8_t t1=s[i]-0x80;
        if(t1<=0x3f) {
            *pi=i+1;
            return ((c-0xc0)<<6)|t1;
        }
    }  // else 0x80<=c<0xc2 is not a lead byte

    /* error handling */
    c=errorValue(i-*pi, strict);
    *pi=i;
    return c;
}